

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_short_*> *fmt)

{
  short *psVar1;
  
  std::operator<<(str,"{ ");
  for (psVar1 = fmt->begin; psVar1 != fmt->end; psVar1 = psVar1 + 1) {
    if (psVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::ostream::operator<<(str,*psVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}